

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O3

void __thiscall Blip_Buffer::clock_rate(Blip_Buffer *this,long cps)

{
  ulong uVar1;
  double dVar2;
  
  this->clocks_per_sec = cps;
  dVar2 = floor(((double)this->samples_per_sec / (double)cps) * 65536.0 + 0.5);
  uVar1 = (long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f | (long)dVar2;
  this->factor_ = uVar1;
  if (uVar1 != 0) {
    return;
  }
  __assert_fail("( \"unmet requirement\", factor_ > 0 )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/fgssfgss[P]NESEmulator/apu_emu/nes_apu/Blip_Buffer.cpp"
                ,0x59,"void Blip_Buffer::clock_rate(long)");
}

Assistant:

void Blip_Buffer::clock_rate( long cps )
{
	clocks_per_sec = cps;
	factor_ = (unsigned long) floor( (double) samples_per_sec / cps *
			(1L << BLIP_BUFFER_ACCURACY) + 0.5 );
	require( factor_ > 0 ); // clock_rate/sample_rate ratio is too large
}